

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttgxvar.c
# Opt level: O2

FT_Error tt_set_mm_blend(TT_Face face,FT_UInt num_coords,FT_Fixed *coords,FT_Bool set_design_coords)

{
  long *plVar1;
  FT_MM_Var *pFVar2;
  FT_Stream stream;
  FT_Memory pFVar3;
  GX_AVarCorrespondence pGVar4;
  long lVar5;
  bool bVar6;
  TT_Face face_00;
  FT_UShort FVar7;
  undefined4 uVar8;
  FT_Error FVar9;
  uint uVar10;
  FT_Fixed *pFVar11;
  FT_ULong FVar12;
  FT_ULong *pFVar13;
  FT_Long FVar14;
  FT_Fixed *pFVar15;
  undefined7 in_register_00000009;
  ulong uVar16;
  long lVar17;
  long lVar18;
  uint uVar19;
  ulong uVar20;
  ulong uVar21;
  GX_Blend pGVar22;
  GX_AVarSegment av;
  ulong uVar23;
  GX_AVarSegment pGVar24;
  FT_Error error;
  FT_Error local_94;
  FT_Memory local_90;
  TT_Face local_88;
  FT_Memory local_80;
  GX_Blend local_78;
  long local_70;
  FT_ULong local_68;
  long local_60;
  ushort local_58;
  ushort local_56;
  long local_50;
  ushort local_48;
  byte local_46;
  long local_40;
  FT_ULong table_len;
  
  local_94 = 0;
  local_80 = (face->root).memory;
  face->doblend = '\0';
  pGVar22 = face->blend;
  if (pGVar22 == (GX_Blend)0x0) {
    FVar9 = TT_Get_MM_Var(face,(FT_MM_Var **)0x0);
    if (FVar9 != 0) {
      return FVar9;
    }
    pGVar22 = face->blend;
  }
  local_94 = 0;
  pFVar2 = pGVar22->mmvar;
  if (pFVar2->num_axis < num_coords) {
    num_coords = pFVar2->num_axis;
  }
  uVar23 = (ulong)num_coords;
  uVar20 = 0;
  while (uVar23 != uVar20) {
    plVar1 = coords + uVar20;
    uVar20 = uVar20 + 1;
    if (*plVar1 - 0x10001U < 0xfffffffffffdffff) {
      return 6;
    }
  }
  local_78 = (GX_Blend)
             CONCAT44(local_78._4_4_,(int)CONCAT71(in_register_00000009,set_design_coords));
  local_88 = face;
  if ((face->is_cff2 == '\0') && (pGVar22->glyphoffsets == (FT_ULong *)0x0)) {
    stream = (face->root).stream;
    pFVar3 = stream->memory;
    error = (*face->goto_table)(face,0x67766172,stream,&table_len);
    if (error != 0) {
      return error;
    }
    local_90 = pFVar3;
    FVar12 = FT_Stream_Pos(stream);
    error = FT_Stream_ReadFields(stream,(FT_Frame_Field *)ft_var_load_gvar_gvar_fields,&local_60);
    if (error != 0) {
      return error;
    }
    if (local_60 != 0x10000) {
      return 8;
    }
    if (local_58 != (ushort)pGVar22->mmvar->num_axis) {
      return 8;
    }
    if (table_len >> 1 <= (ulong)local_58 * (ulong)local_56 &&
        (ulong)local_58 * (ulong)local_56 - (table_len >> 1) != 0) {
      return 8;
    }
    if (table_len < (ulong)local_48 << (local_46 & 1) + 1) {
      return 8;
    }
    pGVar22->gvar_size = table_len;
    pGVar22->tuplecount = (uint)local_56;
    pGVar22->gv_glyphcnt = (uint)local_48;
    local_70 = local_40 + FVar12;
    local_68 = FVar12;
    pFVar13 = (FT_ULong *)ft_mem_realloc(local_90,8,0,(ulong)local_48 + 1,(void *)0x0,&error);
    pGVar22->glyphoffsets = pFVar13;
    if (error != 0) {
      return error;
    }
    uVar20 = (ulong)(pGVar22->gv_glyphcnt + 1);
    if ((local_46 & 1) == 0) {
      FVar9 = FT_Stream_EnterFrame(stream,uVar20 * 2);
      if (FVar9 != 0) {
        return FVar9;
      }
      error = 0;
      for (uVar20 = 0; (uint)uVar20 <= pGVar22->gv_glyphcnt; uVar20 = (ulong)((uint)uVar20 + 1)) {
        FVar7 = FT_Stream_GetUShort(stream);
        pGVar22->glyphoffsets[uVar20] = local_70 + (ulong)FVar7 * 2;
      }
    }
    else {
      FVar9 = FT_Stream_EnterFrame(stream,uVar20 << 2);
      if (FVar9 != 0) {
        return FVar9;
      }
      error = 0;
      for (uVar10 = 0; uVar10 <= pGVar22->gv_glyphcnt; uVar10 = uVar10 + 1) {
        FVar12 = FT_Stream_GetULong(stream);
        pGVar22->glyphoffsets[uVar10] = FVar12 + local_70;
      }
    }
    FT_Stream_ExitFrame(stream);
    if (pGVar22->tuplecount != 0) {
      pFVar15 = (FT_Fixed *)
                ft_mem_realloc(local_90,8,0,(ulong)(pGVar22->tuplecount * (uint)local_58),
                               (void *)0x0,&error);
      pGVar22->tuplecoords = pFVar15;
      if (error != 0) {
        return error;
      }
      error = FT_Stream_Seek(stream,local_68 + local_50);
      if (error != 0) {
        return error;
      }
      FVar9 = FT_Stream_EnterFrame(stream,(ulong)((uint)local_58 * pGVar22->tuplecount) * 2);
      if (FVar9 != 0) {
        return FVar9;
      }
      uVar10 = 0;
      error = 0;
      while( true ) {
        local_90 = (FT_Memory)CONCAT44(local_90._4_4_,uVar10);
        if (pGVar22->tuplecount <= uVar10) break;
        uVar10 = (uint)local_58;
        for (uVar19 = 0; uVar19 < uVar10; uVar19 = uVar19 + 1) {
          FVar7 = FT_Stream_GetUShort(stream);
          uVar10 = (uint)local_58;
          pGVar22->tuplecoords[uVar10 * (int)local_90 + uVar19] = (long)((int)(short)FVar7 << 2);
        }
        uVar10 = (int)local_90 + 1;
      }
      FT_Stream_ExitFrame(stream);
    }
    local_94 = error;
    if (error != 0) {
      return error;
    }
  }
  pFVar15 = pGVar22->coords;
  if (pFVar15 == (FT_Fixed *)0x0) {
    pFVar11 = (FT_Fixed *)ft_mem_realloc(local_80,8,0,(ulong)pFVar2->num_axis,(void *)0x0,&local_94)
    ;
    pGVar22->coords = pFVar11;
    if (local_94 != 0) {
      return local_94;
    }
  }
  pFVar11 = pGVar22->normalizedcoords;
  if (pFVar11 == (FT_Fixed *)0x0) {
    local_90 = (FT_Memory)CONCAT44(local_90._4_4_,1);
    pFVar11 = (FT_Fixed *)ft_mem_realloc(local_80,8,0,(ulong)pFVar2->num_axis,(void *)0x0,&local_94)
    ;
    pGVar22->normalizedcoords = pFVar11;
    if (local_94 != 0) {
      return local_94;
    }
    uVar10 = pFVar2->num_axis;
  }
  else {
    uVar8 = 0;
    for (uVar20 = 0; uVar23 != uVar20; uVar20 = uVar20 + 1) {
      if (pFVar11[uVar20] != coords[uVar20]) {
        uVar8 = 2;
        bVar6 = true;
        goto LAB_00167f34;
      }
    }
    bVar6 = false;
    uVar20 = uVar23;
LAB_00167f34:
    uVar16 = (local_88->root).face_index;
    uVar20 = uVar20 & 0xffffffff;
    if ((uVar16 & 0x7fff0000) == 0) {
      uVar10 = pFVar2->num_axis;
      for (uVar16 = uVar20; (uint)uVar16 < uVar10; uVar16 = uVar16 + 1) {
        if (pFVar11[uVar16] != 0) {
          bVar6 = true;
        }
      }
    }
    else {
      uVar10 = pFVar2->num_axis;
      for (uVar21 = uVar20; (uint)uVar21 < uVar10; uVar21 = uVar21 + 1) {
        if (pFVar11[uVar21] !=
            pGVar22->normalized_stylecoords[((uint)uVar16 >> 0x10) * uVar10 + uVar21]) {
          bVar6 = true;
        }
      }
    }
    if (!bVar6) {
      return -1;
    }
    do {
      if (uVar10 <= uVar20) {
        local_90 = (FT_Memory)CONCAT44(local_90._4_4_,uVar8);
        goto LAB_00168131;
      }
      plVar1 = pFVar11 + uVar20;
      uVar20 = uVar20 + 1;
    } while (*plVar1 == 0);
    local_90 = (FT_Memory)CONCAT44(local_90._4_4_,2);
  }
LAB_00168131:
  pGVar22->num_axis = uVar10;
  memcpy(pFVar11,coords,uVar23 * 8);
  if ((char)local_78 != '\0') {
    if (pFVar15 == (FT_Fixed *)0x0) {
      num_coords = pGVar22->num_axis;
    }
    pFVar15 = pGVar22->coords;
    pFVar11 = pGVar22->normalizedcoords;
    local_78 = local_88->blend;
    uVar10 = local_78->num_axis;
    if (num_coords <= local_78->num_axis) {
      uVar10 = num_coords;
    }
    uVar23 = (ulong)uVar10;
    for (uVar20 = 0; uVar23 != uVar20; uVar20 = uVar20 + 1) {
      pFVar15[uVar20] = pFVar11[uVar20];
    }
    for (uVar20 = uVar23; num_coords != uVar20; uVar20 = uVar20 + 1) {
      pFVar15[uVar20] = 0;
    }
    pGVar24 = local_78->avar_segment;
    if (pGVar24 != (GX_AVarSegment)0x0) {
      for (uVar20 = 0; uVar20 != uVar23; uVar20 = uVar20 + 1) {
        lVar18 = 0;
        for (uVar16 = 1; uVar16 < pGVar24->pairCount; uVar16 = uVar16 + 1) {
          pGVar4 = pGVar24->correspondence;
          lVar17 = *(long *)((long)&pGVar4[1].toCoord + lVar18);
          if (pFVar15[uVar20] < lVar17) {
            lVar5 = *(long *)((long)&pGVar4->toCoord + lVar18);
            FVar14 = FT_MulDiv(pFVar15[uVar20] - lVar5,
                               *(long *)((long)&pGVar4[1].fromCoord + lVar18) -
                               *(long *)((long)&pGVar4->fromCoord + lVar18),lVar17 - lVar5);
            pFVar15[uVar20] = FVar14 + *(long *)((long)&pGVar24->correspondence->fromCoord + lVar18)
            ;
            break;
          }
          lVar18 = lVar18 + 0x10;
        }
        pGVar24 = pGVar24 + 1;
      }
    }
    pFVar11 = &local_78->mmvar->axis->maximum;
    for (uVar20 = 0; uVar23 != uVar20; uVar20 = uVar20 + 1) {
      lVar18 = pFVar15[uVar20];
      if (lVar18 < 0) {
        lVar18 = (long)((int)pFVar11[-1] - (int)pFVar11[-2]) * (long)(int)lVar18;
        lVar17 = (long)(int)((ulong)((lVar18 >> 0x3f) + lVar18 + 0x8000) >> 0x10) + pFVar11[-1];
      }
      else {
        lVar17 = pFVar11[-1];
        if (lVar18 != 0) {
          lVar18 = (long)((int)*pFVar11 - (int)lVar17) * (long)(int)lVar18;
          lVar17 = lVar17 + (int)((ulong)((lVar18 >> 0x3f) + lVar18 + 0x8000) >> 0x10);
        }
      }
      pFVar15[uVar20] = lVar17;
      pFVar11 = pFVar11 + 6;
    }
  }
  face_00 = local_88;
  local_88->doblend = '\x01';
  if (local_88->cvt != (FT_Short *)0x0) {
    if ((int)local_90 == 1) {
      local_94 = tt_face_vary_cvt(local_88,(local_88->root).stream);
    }
    else if ((int)local_90 == 2) {
      ft_mem_free(local_80,local_88->cvt);
      face_00->cvt = (FT_Short *)0x0;
      local_94 = tt_face_load_cvt(face_00,(face_00->root).stream);
    }
  }
  ft_mem_free(local_80,face_00->postscript_name);
  face_00->postscript_name = (char *)0x0;
  return local_94;
}

Assistant:

static FT_Error
  tt_set_mm_blend( TT_Face    face,
                   FT_UInt    num_coords,
                   FT_Fixed*  coords,
                   FT_Bool    set_design_coords )
  {
    FT_Error    error = FT_Err_Ok;
    GX_Blend    blend;
    FT_MM_Var*  mmvar;
    FT_UInt     i;

    FT_Bool     all_design_coords = FALSE;

    FT_Memory   memory = face->root.memory;

    enum
    {
      mcvt_retain,
      mcvt_modify,
      mcvt_load

    } manageCvt;


    face->doblend = FALSE;

    if ( !face->blend )
    {
      if ( FT_SET_ERROR( TT_Get_MM_Var( face, NULL ) ) )
        goto Exit;
    }

    blend = face->blend;
    mmvar = blend->mmvar;

    if ( num_coords > mmvar->num_axis )
    {
      FT_TRACE2(( "TT_Set_MM_Blend:"
                  " only using first %d of %d coordinates\n",
                  mmvar->num_axis, num_coords ));
      num_coords = mmvar->num_axis;
    }

    FT_TRACE5(( "normalized design coordinates:\n" ));

    for ( i = 0; i < num_coords; i++ )
    {
      FT_TRACE5(( "  %.5f\n", coords[i] / 65536.0 ));
      if ( coords[i] < -0x00010000L || coords[i] > 0x00010000L )
      {
        FT_TRACE1(( "TT_Set_MM_Blend: normalized design coordinate %.5f\n"
                    "                 is out of range [-1;1]\n",
                    coords[i] / 65536.0 ));
        error = FT_THROW( Invalid_Argument );
        goto Exit;
      }
    }

    FT_TRACE5(( "\n" ));

    if ( !face->is_cff2 && !blend->glyphoffsets )
      if ( FT_SET_ERROR( ft_var_load_gvar( face ) ) )
        goto Exit;

    if ( !blend->coords )
    {
      if ( FT_NEW_ARRAY( blend->coords, mmvar->num_axis ) )
        goto Exit;

      /* the first time we have to compute all design coordinates */
      all_design_coords = TRUE;
    }

    if ( !blend->normalizedcoords )
    {
      if ( FT_NEW_ARRAY( blend->normalizedcoords, mmvar->num_axis ) )
        goto Exit;

      manageCvt = mcvt_modify;

      /* If we have not set the blend coordinates before this, then the  */
      /* cvt table will still be what we read from the `cvt ' table and  */
      /* we don't need to reload it.  We may need to change it though... */
    }
    else
    {
      FT_Bool    have_diff = 0;
      FT_UInt    j;
      FT_Fixed*  c;
      FT_Fixed*  n;


      manageCvt = mcvt_retain;

      for ( i = 0; i < num_coords; i++ )
      {
        if ( blend->normalizedcoords[i] != coords[i] )
        {
          manageCvt = mcvt_load;
          have_diff = 1;
          break;
        }
      }

      if ( FT_IS_NAMED_INSTANCE( FT_FACE( face ) ) )
      {
        FT_UInt  idx = (FT_UInt)face->root.face_index >> 16;


        c = blend->normalizedcoords + i;
        n = blend->normalized_stylecoords + idx * mmvar->num_axis + i;
        for ( j = i; j < mmvar->num_axis; j++, n++, c++ )
          if ( *c != *n )
            have_diff = 1;
      }
      else
      {
        c = blend->normalizedcoords + i;
        for ( j = i; j < mmvar->num_axis; j++, c++ )
          if ( *c != 0 )
            have_diff = 1;
      }

      /* return value -1 indicates `no change' */
      if ( !have_diff )
        return -1;

      for ( ; i < mmvar->num_axis; i++ )
      {
        if ( blend->normalizedcoords[i] != 0 )
        {
          manageCvt = mcvt_load;
          break;
        }
      }

      /* If we don't change the blend coords then we don't need to do  */
      /* anything to the cvt table.  It will be correct.  Otherwise we */
      /* no longer have the original cvt (it was modified when we set  */
      /* the blend last time), so we must reload and then modify it.   */
    }

    blend->num_axis = mmvar->num_axis;
    FT_MEM_COPY( blend->normalizedcoords,
                 coords,
                 num_coords * sizeof ( FT_Fixed ) );

    if ( set_design_coords )
      ft_var_to_design( face,
                        all_design_coords ? blend->num_axis : num_coords,
                        blend->normalizedcoords,
                        blend->coords );

    face->doblend = TRUE;

    if ( face->cvt )
    {
      switch ( manageCvt )
      {
      case mcvt_load:
        /* The cvt table has been loaded already; every time we change the */
        /* blend we may need to reload and remodify the cvt table.         */
        FT_FREE( face->cvt );
        face->cvt = NULL;

        error = tt_face_load_cvt( face, face->root.stream );
        break;

      case mcvt_modify:
        /* The original cvt table is in memory.  All we need to do is */
        /* apply the `cvar' table (if any).                           */
        error = tt_face_vary_cvt( face, face->root.stream );
        break;

      case mcvt_retain:
        /* The cvt table is correct for this set of coordinates. */
        break;
      }
    }

    /* enforce recomputation of the PostScript name; */
    FT_FREE( face->postscript_name );
    face->postscript_name = NULL;

  Exit:
    return error;
  }